

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O1

Lista<int> * __thiscall Lista<int>::operator=(Lista<int> *this,Lista<int> *aCopiar)

{
  int iVar1;
  uint uVar2;
  Nodo *pNVar3;
  Nodo *pNVar4;
  ulong uVar5;
  Lista<int> *pLVar6;
  ulong uVar7;
  
  eliminarTodos(this);
  uVar2 = 0;
  for (pNVar4 = aCopiar->_prim; pNVar4 != (Nodo *)0x0; pNVar4 = pNVar4->_sig) {
    uVar2 = uVar2 + 1;
  }
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      pNVar4 = aCopiar->_prim;
      for (uVar5 = uVar7; uVar5 != 0; uVar5 = uVar5 - 1) {
        pNVar4 = pNVar4->_sig;
      }
      iVar1 = pNVar4->_valor;
      pNVar3 = (Nodo *)operator_new(0x18);
      pNVar4 = this->_ult;
      pNVar3->_valor = iVar1;
      pNVar3->_sig = (Nodo *)0x0;
      pNVar3->_ant = pNVar4;
      pLVar6 = (Lista<int> *)&pNVar4->_sig;
      if (this->_prim == (Nodo *)0x0) {
        pLVar6 = this;
      }
      pLVar6->_prim = pNVar3;
      this->_ult = pNVar3;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  return this;
}

Assistant:

Lista<T>& Lista<T>::operator=(const Lista<T>& aCopiar) {
    this->eliminarTodos();
    int longitud = aCopiar.longitud();
    for(int i = 0; i < longitud; i++) {
        T iesimo = aCopiar.iesimo(i);
        this->agregarAtras(iesimo);
    }
    return *this;
}